

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Pipeline::Pipeline(Pipeline *this,Pipeline *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pipeline_003b8fa0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->models_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->models_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
            (&(this->models_).super_RepeatedPtrFieldBase,&(from->models_).super_RepeatedPtrFieldBase
            );
  (this->names_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->names_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->names_).super_RepeatedPtrFieldBase,&(from->names_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

Pipeline::Pipeline(const Pipeline& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      models_(from.models_),
      names_(from.names_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Pipeline)
}